

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O2

long __thiscall mnf::RealSpace::getTypeId(RealSpace *this)

{
  uint uVar1;
  
  uVar1 = utils::hash::computeHash<10>((char (*) [10])"RealSpace");
  return (ulong)uVar1;
}

Assistant:

long RealSpace::getTypeId() const
{
  long typeId = utils::hash::computeHash("RealSpace");
  return typeId;
}